

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_freeallobjects(lua_State *L)

{
  GCObject **p;
  global_State *pgVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  pgVar1 = L->l_G;
  pGVar4 = (GCObject *)&pgVar1->tobefnz;
  do {
    pGVar3 = pGVar4;
    pGVar4 = pGVar3->next;
  } while (pGVar4 != (GCObject *)0x0);
  p = &pgVar1->finobj;
  pGVar4 = pgVar1->finobj;
  while (pGVar4 != (GCObject *)0x0) {
    *p = pGVar4->next;
    pGVar4->next = pGVar3->next;
    pGVar3->next = pGVar4;
    pGVar3 = pGVar4;
    pGVar4 = *p;
  }
  pgVar2 = L->l_G;
  while (pgVar2->tobefnz != (GCObject *)0x0) {
    GCTM(L,0);
  }
  pgVar1->currentwhite = '\x03';
  pgVar1->gckind = '\0';
  sweeplist(L,p,0xffffffffffffffff);
  sweeplist(L,&pgVar1->allgc,0xffffffffffffffff);
  sweeplist(L,&pgVar1->fixedgc,0xffffffffffffffff);
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  luaC_changemode(L, KGC_INC);
  separatetobefnz(g, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L);
  deletelist(L, g->allgc, obj2gco(g->mainthread));
  deletelist(L, g->finobj, NULL);
  deletelist(L, g->fixedgc, NULL);  /* collect fixed objects */
  lua_assert(g->strt.nuse == 0);
}